

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void copyhdu(void)

{
  int iVar1;
  undefined1 local_40 [4];
  undefined4 local_3c;
  int hdutype;
  int morekeys;
  int status;
  char cStack_2c;
  char cStack_2b;
  char outfilename [13];
  char infilename [13];
  fitsfile *outfptr;
  fitsfile *infptr;
  
  builtin_strncpy(outfilename + 5,"atestfil",8);
  builtin_strncpy(infilename,".fit",5);
  morekeys._2_1_ = 'b';
  morekeys._3_1_ = 't';
  status._0_1_ = 'e';
  status._1_1_ = 's';
  status._2_1_ = 't';
  status._3_1_ = 'f';
  cStack_2c = 'i';
  cStack_2b = 'l';
  builtin_strncpy(outfilename,".fit",5);
  hdutype = 0;
  remove((char *)((long)&morekeys + 2));
  iVar1 = ffopentest(10,&outfptr,outfilename + 5,0,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  iVar1 = ffinit(infilename + 5,(long)&morekeys + 2,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  local_3c = 0;
  iVar1 = ffcopy(outfptr,infilename._5_8_,0,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  iVar1 = ffmahd(outfptr,3,local_40,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  iVar1 = ffcopy(outfptr,infilename._5_8_,local_3c,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  iVar1 = ffclos(infilename._5_8_,&hdutype);
  if ((iVar1 == 0) && (iVar1 = ffclos(outfptr,&hdutype), iVar1 == 0)) {
    return;
  }
  printerror(hdutype);
  return;
}

Assistant:

void copyhdu( void)
{
    /********************************************************************/
    /* copy the 1st and 3rd HDUs from the input file to a new FITS file */
    /********************************************************************/
    fitsfile *infptr;      /* pointer to the FITS file, defined in fitsio.h */
    fitsfile *outfptr;                 /* pointer to the new FITS file      */

    char infilename[]  = "atestfil.fit";  /* name for existing FITS file   */
    char outfilename[] = "btestfil.fit";  /* name for new FITS file        */

    int status, morekeys, hdutype;

    status = 0;

    remove(outfilename);            /* Delete old file if it already exists */

    /* open the existing FITS file */
    if ( fits_open_file(&infptr, infilename, READONLY, &status) ) 
         printerror( status );

    if (fits_create_file(&outfptr, outfilename, &status)) /*create FITS file*/
         printerror( status );           /* call printerror if error occurs */

    /* copy the primary array from the input file to the output file */
    morekeys = 0;     /* don't reserve space for additional keywords */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    /* move to the 3rd HDU in the input file */
    if ( fits_movabs_hdu(infptr, 3, &hdutype, &status) )
         printerror( status );

    /* copy 3rd HDU from the input file to the output file (to 2nd HDU) */
    if ( fits_copy_hdu(infptr, outfptr, morekeys, &status) )
         printerror( status );

    if (fits_close_file(outfptr, &status) ||
        fits_close_file(infptr, &status)) /* close files */
         printerror( status );

    return;
}